

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::DoubletonEquationPS::execute
          (DoubletonEquationPS *this,VectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *param_4,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  VarStatus *pVVar4;
  double *pdVar5;
  char *pcVar6;
  int __c;
  int __c_00;
  long *in_RDI;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_R9;
  double dVar7;
  double dVar8;
  int _k;
  double aik;
  double val;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  VectorBase<double> *in_stack_ffffffffffffff60;
  SVectorBase<double> *in_stack_ffffffffffffff68;
  uint local_4c;
  double local_40;
  
  pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                     (in_R9,*(int *)((long)in_RDI + 0x2c));
  if (*pVVar4 == BASIC) {
    return;
  }
  pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                     (in_R9,*(int *)((long)in_RDI + 0x2c));
  if (((*pVVar4 != ON_LOWER) || ((*(byte *)(in_RDI + 10) & 1) == 0)) &&
     ((pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                          (in_R9,*(int *)((long)in_RDI + 0x2c)), *pVVar4 != ON_UPPER ||
      ((*(byte *)((long)in_RDI + 0x51) & 1) == 0)))) {
    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (in_R9,*(int *)((long)in_RDI + 0x2c));
    if (*pVVar4 != FIXED) {
      return;
    }
    if (((*(byte *)((long)in_RDI + 0x34) & 1) == 0) ||
       (((pdVar5 = VectorBase<double>::operator[]
                             (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c), *pdVar5 <= 0.0
         || ((*(byte *)((long)in_RDI + 0x51) & 1) == 0)) &&
        ((pdVar5 = VectorBase<double>::operator[]
                             (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c),
         0.0 < *pdVar5 || *pdVar5 == 0.0 || ((*(byte *)(in_RDI + 10) & 1) == 0)))))) {
      if ((*(byte *)((long)in_RDI + 0x34) & 1) != 0) {
        return;
      }
      pdVar5 = VectorBase<double>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      if ((*pdVar5 <= 0.0) || ((*(byte *)(in_RDI + 10) & 1) == 0)) {
        pdVar5 = VectorBase<double>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c)
        ;
        if (0.0 < *pdVar5 || *pdVar5 == 0.0) {
          return;
        }
        if ((*(byte *)((long)in_RDI + 0x51) & 1) == 0) {
          return;
        }
      }
    }
  }
  local_40 = (double)in_RDI[8];
  dVar7 = SVectorBase<double>::operator[]
                    (in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  for (local_4c = 0; iVar3 = SVectorBase<double>::size((SVectorBase<double> *)(in_RDI + 0x14)),
      (int)local_4c < iVar3; local_4c = local_4c + 1) {
    pcVar6 = SVectorBase<double>::index
                       ((SVectorBase<double> *)(in_RDI + 0x14),(char *)(ulong)local_4c,__c);
    if ((int)pcVar6 != (int)in_RDI[6]) {
      pdVar5 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0x14),local_4c);
      dVar8 = *pdVar5;
      SVectorBase<double>::index
                ((SVectorBase<double> *)(in_RDI + 0x14),(char *)(ulong)local_4c,__c_00);
      pdVar5 = VectorBase<double>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      local_40 = local_40 - dVar8 * *pdVar5;
    }
  }
  pdVar5 = VectorBase<double>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  *pdVar5 = local_40 / dVar7;
  pdVar5 = VectorBase<double>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  *pdVar5 = 0.0;
  dVar8 = (double)in_RDI[7];
  dVar1 = (double)in_RDI[9];
  pdVar5 = VectorBase<double>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  *pdVar5 = dVar8 - (local_40 * dVar1) / dVar7;
  if ((*(byte *)((long)in_RDI + 0x35) & 1) != 0) {
    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[5]);
    *pVVar4 = FIXED;
    goto LAB_0028f709;
  }
  pdVar5 = VectorBase<double>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  dVar7 = *pdVar5;
  dVar8 = (double)(**(code **)(*in_RDI + 0x38))();
  bVar2 = GT<double,double,double>(dVar7,0.0,dVar8);
  if (bVar2) {
LAB_0028f6d5:
    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[5]);
    *pVVar4 = ON_LOWER;
  }
  else {
    VectorBase<double>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    (**(code **)(*in_RDI + 0x38))();
    bVar2 = isZero<double,double>
                      ((double)in_stack_ffffffffffffff60,
                       (double)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (bVar2) {
      VectorBase<double>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      dVar7 = (double)in_RDI[0xf];
      (**(code **)(*in_RDI + 0x38))();
      bVar2 = EQ<double,double,double>
                        (dVar7,(double)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                         ,1.32637999633526e-317);
      if (bVar2) goto LAB_0028f6d5;
    }
    pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[5]);
    *pVVar4 = ON_UPPER;
  }
LAB_0028f709:
  pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                     (in_R9,*(int *)((long)in_RDI + 0x2c));
  *pVVar4 = BASIC;
  return;
}

Assistant:

void SPxMainSM<R>::DoubletonEquationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // dual:
   if((cStatus[m_k]  != SPxSolverBase<R>::BASIC) &&
         ((cStatus[m_k] == SPxSolverBase<R>::ON_LOWER && m_strictLo) ||
          (cStatus[m_k] == SPxSolverBase<R>::ON_UPPER && m_strictUp) ||
          (cStatus[m_k] == SPxSolverBase<R>::FIXED    &&
           ((m_maxSense && ((r[m_j] > 0 && m_strictUp) || (r[m_j] < 0 && m_strictLo))) ||
            (!m_maxSense && ((r[m_j] > 0 && m_strictLo) || (r[m_j] < 0 && m_strictUp)))))))
   {
      R val  = m_kObj;
      R aik  = m_col[m_i];

      for(int _k = 0; _k < m_col.size(); ++_k)
      {
         if(m_col.index(_k) != m_i)
            val -= m_col.value(_k) * y[m_col.index(_k)];
      }

      y[m_i] = val / aik;
      r[m_k] = 0.0;

      r[m_j] = m_jObj - val * m_aij / aik;

      SOPLEX_ASSERT_WARN("WMAISM73", isNotZero(m_aij * aik, this->epsilon()));

      // basis:
      if(m_jFixed)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else
      {
         if(GT(r[m_j], (R) 0, this->epsilon()) || (isZero(r[m_j], this->epsilon())
               && EQ(x[m_j], m_Lo_j, this->epsilon())))
            cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
         else
            cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }

      cStatus[m_k] = SPxSolverBase<R>::BASIC;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM23 Dimension doesn't match after this step.");
   }

#endif
}